

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

int AF_A_RocketInFlight(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClassActor *pPVar6;
  AActor *pAVar7;
  uint uVar8;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  bool bVar11;
  FSoundID local_60;
  FName local_5c;
  DVector2 v;
  DAngle local_38;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f94d3;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar7 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar7 == (AActor *)0x0) {
LAB_005f92d3:
        pAVar7 = (AActor *)0x0;
        pVVar9 = param;
        uVar8 = numparam;
      }
      else {
        pPVar5 = (pAVar7->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (pAVar7->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar10 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        bVar11 = pPVar5 == pPVar3;
        if (!bVar11 && !bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
        uVar8 = (uint)bVar10;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f94d3;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005f9393;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005f94c3;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
              puVar2[1] = pPVar5;
            }
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar10) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar10 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005f94d3;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005f94c3;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f9393:
        local_60.ID = S_FindSound("misc/missileinflight");
        S_Sound(pAVar7,2,&local_60,1.0,1.0);
        pPVar6 = PClass::FindActor("MiniMissilePuff");
        v.X = (pAVar7->__Pos).X;
        v.Y = (pAVar7->__Pos).Y;
        local_38.Degrees = (pAVar7->Angles).Yaw.Degrees + -180.0;
        local_30.Degrees = local_38.Degrees;
        P_SpawnPuff(pAVar7,pPVar6,(DVector3 *)&v,&local_30,&local_38,2,1,(AActor *)0x0);
        iVar4 = FName::NameManager::FindName(&FName::NameData,"RocketTrail",false);
        P_GetOffsetPosition((pAVar7->__Pos).X,(pAVar7->__Pos).Y,-(pAVar7->Vel).X,-(pAVar7->Vel).Y);
        local_5c.Index = iVar4;
        pPVar6 = ClassForSpawn(&local_5c);
        pAVar7 = AActor::StaticSpawn(pPVar6,(DVector3 *)&v,ALLOW_REPLACE,false);
        if (pAVar7 != (AActor *)0x0) {
          (pAVar7->Vel).Z = 1.0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005f94d3;
    }
    if (pAVar7 == (AActor *)0x0) goto LAB_005f92d3;
  }
LAB_005f94c3:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005f94d3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x179,"int AF_A_RocketInFlight(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RocketInFlight)
{
	PARAM_ACTION_PROLOGUE;

	AActor *trail;

	S_Sound (self, CHAN_VOICE, "misc/missileinflight", 1, ATTN_NORM);
	P_SpawnPuff (self, PClass::FindActor("MiniMissilePuff"), self->Pos(), self->Angles.Yaw - 180, self->Angles.Yaw - 180, 2, PF_HITTHING);
	trail = Spawn("RocketTrail", self->Vec3Offset(-self->Vel.X, -self->Vel.Y, 0.), ALLOW_REPLACE);
	if (trail != NULL)
	{
		trail->Vel.Z = 1;
	}
	return 0;
}